

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# palette.c
# Opt level: O2

int av1_palette_color_cost_uv
              (PALETTE_MODE_INFO *pmi,uint16_t *color_cache,int n_cache,int bit_depth)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int min_bits_v;
  int zero_count;
  uint8_t cache_color_found [16];
  int out_cache_colors [8];
  int local_70;
  int local_6c;
  uint8_t local_68 [16];
  int local_58 [10];
  
  bVar1 = pmi->palette_size[1];
  iVar2 = av1_index_color_cache
                    (color_cache,n_cache,pmi->palette_colors + 8,(uint)bVar1,local_68,local_58);
  iVar3 = delta_encode_cost(local_58,iVar2,bit_depth,0);
  local_6c = 0;
  local_70 = 0;
  iVar2 = av1_get_palette_delta_bits_v(pmi,bit_depth,&local_6c,&local_70);
  iVar4 = (bit_depth - local_6c) + (bVar1 - 1) * (iVar2 + 1) + 2;
  iVar2 = (uint)bVar1 * bit_depth;
  if (iVar4 < (int)((uint)bVar1 * bit_depth)) {
    iVar2 = iVar4;
  }
  return (iVar3 + n_cache + iVar2) * 0x200 + 0x200;
}

Assistant:

int av1_palette_color_cost_uv(const PALETTE_MODE_INFO *const pmi,
                              const uint16_t *color_cache, int n_cache,
                              int bit_depth) {
  const int n = pmi->palette_size[1];
  int total_bits = 0;
  // U channel palette color cost.
  int out_cache_colors[PALETTE_MAX_SIZE];
  uint8_t cache_color_found[2 * PALETTE_MAX_SIZE];
  const int n_out_cache = av1_index_color_cache(
      color_cache, n_cache, pmi->palette_colors + PALETTE_MAX_SIZE, n,
      cache_color_found, out_cache_colors);
  total_bits +=
      n_cache + delta_encode_cost(out_cache_colors, n_out_cache, bit_depth, 0);

  // V channel palette color cost.
  int zero_count = 0, min_bits_v = 0;
  const int bits_v =
      av1_get_palette_delta_bits_v(pmi, bit_depth, &zero_count, &min_bits_v);
  const int bits_using_delta =
      2 + bit_depth + (bits_v + 1) * (n - 1) - zero_count;
  const int bits_using_raw = bit_depth * n;
  total_bits += 1 + AOMMIN(bits_using_delta, bits_using_raw);
  return av1_cost_literal(total_bits);
}